

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUtility.cpp
# Opt level: O1

uint8_t GmmIsUVPacked(GMM_RESOURCE_FORMAT Format)

{
  uint8_t uVar1;
  
  if ((0x24 < Format - GMM_FORMAT_NV11) ||
     (uVar1 = '\x01', (0x10000000f7U >> ((ulong)(Format - GMM_FORMAT_NV11) & 0x3f) & 1) == 0)) {
    uVar1 = '\0';
  }
  return uVar1;
}

Assistant:

uint8_t GMM_STDCALL GmmIsUVPacked(GMM_RESOURCE_FORMAT Format)
{
    uint8_t Status = 0;

    switch(Format)
    {
        case GMM_FORMAT_NV11:
        case GMM_FORMAT_NV12:
        case GMM_FORMAT_NV21:
        case GMM_FORMAT_P010:
        case GMM_FORMAT_P012:
        case GMM_FORMAT_P016:
        case GMM_FORMAT_P208:
        case GMM_FORMAT_P216:
            Status = 1;
            break;
        default:
            Status = 0;
            break;
    }
    return Status;
}